

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

NamedConditionalDirectiveExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NamedConditionalDirectiveExpressionSyntax,slang::syntax::NamedConditionalDirectiveExpressionSyntax_const&>
          (BumpAllocator *this,NamedConditionalDirectiveExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SyntaxKind SVar6;
  undefined4 uVar7;
  NamedConditionalDirectiveExpressionSyntax *pNVar8;
  
  pNVar8 = (NamedConditionalDirectiveExpressionSyntax *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NamedConditionalDirectiveExpressionSyntax *)this->endPtr < pNVar8 + 1) {
    pNVar8 = (NamedConditionalDirectiveExpressionSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pNVar8 + 1);
  }
  (pNVar8->name).info = (args->name).info;
  SVar6 = (args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.kind;
  uVar7 = *(undefined4 *)
           &(args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.parent;
  TVar2 = (args->name).kind;
  uVar3 = (args->name).field_0x2;
  NVar4.raw = (args->name).numFlags.raw;
  uVar5 = (args->name).rawLen;
  (pNVar8->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.previewNode =
       (args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.previewNode;
  (pNVar8->name).kind = TVar2;
  (pNVar8->name).field_0x2 = uVar3;
  (pNVar8->name).numFlags = (NumericTokenFlags)NVar4.raw;
  (pNVar8->name).rawLen = uVar5;
  (pNVar8->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.kind = SVar6;
  *(undefined4 *)&(pNVar8->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.field_0x4 =
       uVar7;
  (pNVar8->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.parent = pSVar1;
  return pNVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }